

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmc3.c
# Opt level: O3

Vec_Int_t * Saig_ManBmcComputeMappingRefs(Aig_Man_t *p,Vec_Int_t *vMap)

{
  uint uVar1;
  int iVar2;
  Vec_Ptr_t *pVVar3;
  Vec_Ptr_t *pVVar4;
  void **ppvVar5;
  void *pvVar6;
  int *piVar7;
  uint uVar8;
  Vec_Int_t *pVVar9;
  int *__s;
  ulong uVar10;
  long lVar11;
  
  pVVar3 = p->vObjs;
  uVar1 = pVVar3->nSize;
  pVVar9 = (Vec_Int_t *)malloc(0x10);
  uVar8 = 0x10;
  if (0xe < uVar1 - 1) {
    uVar8 = uVar1;
  }
  pVVar9->nCap = uVar8;
  if (uVar8 == 0) {
    pVVar9->pArray = (int *)0x0;
    pVVar9->nSize = uVar1;
  }
  else {
    __s = (int *)malloc((long)(int)uVar8 << 2);
    pVVar9->pArray = __s;
    pVVar9->nSize = uVar1;
    if (__s != (int *)0x0) {
      memset(__s,0,(long)(int)uVar1 << 2);
      goto LAB_0056dc8f;
    }
  }
  __s = (int *)0x0;
LAB_0056dc8f:
  pVVar4 = p->vCos;
  if (pVVar4->nSize < 1) {
    if ((int)uVar1 < 1) {
      return pVVar9;
    }
  }
  else {
    ppvVar5 = pVVar4->pArray;
    lVar11 = 0;
    do {
      uVar10 = *(ulong *)((long)ppvVar5[lVar11] + 8);
      if (uVar10 == 0) {
LAB_0056dd5f:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      iVar2 = *(int *)((uVar10 & 0xfffffffffffffffe) + 0x24);
      if (((long)iVar2 < 0) || ((int)uVar1 <= iVar2)) goto LAB_0056dd5f;
      __s[iVar2] = __s[iVar2] + 1;
      lVar11 = lVar11 + 1;
    } while (lVar11 < pVVar4->nSize);
  }
  ppvVar5 = pVVar3->pArray;
  uVar10 = 0;
  do {
    pvVar6 = ppvVar5[uVar10];
    if ((pvVar6 != (void *)0x0) && (0xfffffffd < (*(uint *)((long)pvVar6 + 0x18) & 7) - 7)) {
      if ((long)vMap->nSize <= (long)uVar10) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      piVar7 = vMap->pArray;
      uVar8 = piVar7[uVar10];
      if ((ulong)uVar8 != 0) {
        if (((int)uVar8 < 0) || ((uint)vMap->nSize <= uVar8)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                        ,0x1ba,"int *Vec_IntEntryP(Vec_Int_t *, int)");
        }
        lVar11 = 0;
        do {
          iVar2 = piVar7[(ulong)uVar8 + lVar11 + 1];
          if (-1 < (long)iVar2) {
            if ((int)uVar1 <= iVar2) goto LAB_0056dd5f;
            __s[iVar2] = __s[iVar2] + 1;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 != 4);
      }
    }
    uVar10 = uVar10 + 1;
    if (uVar1 <= uVar10) {
      return pVVar9;
    }
  } while( true );
}

Assistant:

Vec_Int_t * Saig_ManBmcComputeMappingRefs( Aig_Man_t * p, Vec_Int_t * vMap )
{
    Vec_Int_t * vRefs;
    Aig_Obj_t * pObj;
    int i, iFan, * pData;
    vRefs = Vec_IntStart( Aig_ManObjNumMax(p) );
    Aig_ManForEachCo( p, pObj, i )
        Vec_IntAddToEntry( vRefs, Aig_ObjFaninId0(pObj), 1 );
    Aig_ManForEachNode( p, pObj, i )
    {
        if ( Vec_IntEntry(vMap, i) == 0 )
            continue;
        pData = Vec_IntEntryP( vMap, Vec_IntEntry(vMap, i) );
        for ( iFan = 0; iFan < 4; iFan++ )
            if ( pData[iFan+1] >= 0 )
                Vec_IntAddToEntry( vRefs, pData[iFan+1], 1 );
    }
    return vRefs;
}